

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_physfs.c
# Opt level: O3

int cmd_setsaneconfig(char *args)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  char *__s;
  
  pcVar3 = strchr(args,0x20);
  *pcVar3 = '\0';
  pcVar4 = strchr(pcVar3 + 1,0x20);
  *pcVar4 = '\0';
  __s = pcVar4 + 1;
  pcVar5 = strchr(__s,0x20);
  *pcVar5 = '\0';
  iVar1 = atoi(__s);
  iVar2 = atoi(pcVar5 + 1);
  if ((pcVar4[1] == '!') && (pcVar4[2] == '\0')) {
    __s = (char *)0x0;
  }
  iVar1 = PHYSFS_setSaneConfig(args,pcVar3 + 1,__s,iVar1,iVar2);
  if (iVar1 == 0) {
    uVar6 = PHYSFS_getLastError();
    printf("Failure. reason: %s.\n",uVar6);
  }
  else {
    puts("Successful.");
  }
  return 1;
}

Assistant:

static int cmd_setsaneconfig(char *args)
{
    char *org;
    char *appName;
    char *arcExt;
    int inclCD;
    int arcsFirst;
    char *ptr = args;

        /* ugly. */
    org = ptr;
    ptr = strchr(ptr, ' '); *ptr = '\0'; ptr++; appName = ptr;
    ptr = strchr(ptr, ' '); *ptr = '\0'; ptr++; arcExt = ptr;
    ptr = strchr(ptr, ' '); *ptr = '\0'; ptr++; inclCD = atoi(arcExt);
    arcsFirst = atoi(ptr);

    if (strcmp(arcExt, "!") == 0)
        arcExt = NULL;

    if (PHYSFS_setSaneConfig(org, appName, arcExt, inclCD, arcsFirst))
        printf("Successful.\n");
    else
        printf("Failure. reason: %s.\n", PHYSFS_getLastError());

    return 1;
}